

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack25_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x2000000 | uVar1 - base;
  uVar2 = in[1] - base >> 7;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x40000 | uVar2;
  uVar2 = in[2] - base >> 0xe;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x800 | uVar2;
  uVar2 = in[3] - base >> 0x15;
  out[3] = uVar2;
  uVar2 = (in[4] - base) * 0x10 | uVar2;
  out[3] = uVar2;
  out[3] = (in[5] - base) * 0x20000000 | uVar2;
  uVar2 = in[5] - base >> 3;
  out[4] = uVar2;
  out[4] = (in[6] - base) * 0x400000 | uVar2;
  uVar2 = in[6] - base >> 10;
  out[5] = uVar2;
  out[5] = (in[7] - base) * 0x8000 | uVar2;
  uVar2 = in[7] - base >> 0x11;
  out[6] = uVar2;
  out[6] = (in[8] - base) * 0x100 | uVar2;
  uVar2 = in[8] - base >> 0x18;
  out[7] = uVar2;
  uVar2 = (in[9] - base) * 2 | uVar2;
  out[7] = uVar2;
  out[7] = (in[10] - base) * 0x4000000 | uVar2;
  uVar2 = in[10] - base >> 6;
  out[8] = uVar2;
  out[8] = (in[0xb] - base) * 0x80000 | uVar2;
  uVar2 = in[0xb] - base >> 0xd;
  out[9] = uVar2;
  out[9] = (in[0xc] - base) * 0x1000 | uVar2;
  uVar2 = in[0xc] - base >> 0x14;
  out[10] = uVar2;
  uVar2 = (in[0xd] - base) * 0x20 | uVar2;
  out[10] = uVar2;
  out[10] = (in[0xe] - base) * 0x40000000 | uVar2;
  uVar2 = in[0xe] - base >> 2;
  out[0xb] = uVar2;
  out[0xb] = (in[0xf] - base) * 0x800000 | uVar2;
  out[0xc] = in[0xf] - base >> 9;
  return out + 0xd;
}

Assistant:

uint32_t * pack25_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  18 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  18 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  11 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  11 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  15 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  15 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  1 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  1 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  19 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  19 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  5 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  5 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  23 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  23 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 25  -  16 );
    ++in;

    return out + 1;
}